

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMatcher.h
# Opt level: O3

bool __thiscall OrderMatcher::insert(OrderMatcher *this,Order *order)

{
  bool bVar1;
  iterator iVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>,_bool>
  pVar3;
  Market MStack_1a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>
  local_f8;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
                  *)this,&order->m_symbol);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->m_markets)._M_t._M_impl.super__Rb_tree_header) {
    memset(&MStack_1a8,0,0xb0);
    std::_Deque_base<Order,_std::allocator<Order>_>::_M_initialize_map
              ((_Deque_base<Order,_std::allocator<Order>_> *)&MStack_1a8,0);
    MStack_1a8.m_bidOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &MStack_1a8.m_bidOrders._M_t._M_impl.super__Rb_tree_header._M_header;
    MStack_1a8.m_bidOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    MStack_1a8.m_bidOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    MStack_1a8.m_bidOrders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    MStack_1a8.m_askOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &MStack_1a8.m_askOrders._M_t._M_impl.super__Rb_tree_header._M_header;
    MStack_1a8.m_askOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    MStack_1a8.m_askOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    MStack_1a8.m_askOrders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    MStack_1a8.m_bidOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         MStack_1a8.m_bidOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    MStack_1a8.m_askOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         MStack_1a8.m_askOrders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>::
    pair<Market,_true>(&local_f8,&order->m_symbol,&MStack_1a8);
    pVar3 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Market>,std::_Select1st<std::pair<std::__cxx11::string_const,Market>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Market>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,Market>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Market>,std::_Select1st<std::pair<std::__cxx11::string_const,Market>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Market>>>
                        *)this,&local_f8);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    std::
    _Rb_tree<double,_std::pair<const_double,_Order>,_std::_Select1st<std::pair<const_double,_Order>_>,_std::less<double>,_std::allocator<std::pair<const_double,_Order>_>_>
    ::~_Rb_tree(&local_f8.second.m_askOrders._M_t);
    std::
    _Rb_tree<double,_std::pair<const_double,_Order>,_std::_Select1st<std::pair<const_double,_Order>_>,_std::greater<double>,_std::allocator<std::pair<const_double,_Order>_>_>
    ::~_Rb_tree(&local_f8.second.m_bidOrders._M_t);
    std::deque<Order,_std::allocator<Order>_>::~deque
              ((deque<Order,_std::allocator<Order>_> *)&local_f8.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.first._M_dataplus._M_p != &local_f8.first.field_2) {
      operator_delete(local_f8.first._M_dataplus._M_p,
                      local_f8.first.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<double,_std::pair<const_double,_Order>,_std::_Select1st<std::pair<const_double,_Order>_>,_std::less<double>,_std::allocator<std::pair<const_double,_Order>_>_>
    ::~_Rb_tree(&MStack_1a8.m_askOrders._M_t);
    std::
    _Rb_tree<double,_std::pair<const_double,_Order>,_std::_Select1st<std::pair<const_double,_Order>_>,_std::greater<double>,_std::allocator<std::pair<const_double,_Order>_>_>
    ::~_Rb_tree(&MStack_1a8.m_bidOrders._M_t);
    std::deque<Order,_std::allocator<Order>_>::~deque
              ((deque<Order,_std::allocator<Order>_> *)&MStack_1a8);
  }
  bVar1 = Market::insert((Market *)(iVar2._M_node + 2),order);
  return bVar1;
}

Assistant:

bool insert(const Order &order) {
    Markets::iterator i = m_markets.find(order.getSymbol());
    if (i == m_markets.end()) {
      i = m_markets.insert(std::make_pair(order.getSymbol(), Market())).first;
    }
    return i->second.insert(order);
  }